

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

int SDL_DisplayYUVOverlay(SDL12_Overlay *overlay12,SDL12_Rect *dstrect12)

{
  undefined8 *puVar1;
  code *pcVar2;
  Uint32 UVar3;
  SDL_AssertState SVar4;
  int iVar5;
  unsigned_long uVar6;
  QueuedOverlayItem *pQVar7;
  SDL_AssertState sdl_assert_state_1;
  SDL_AssertState sdl_assert_state;
  SDL_Rect rect20;
  SDL_bool ThisIsSetVideoModeThread;
  SDL_Renderer *renderer;
  SDL12_YUVData *hwdata;
  QueuedOverlayItem *overlay;
  SDL12_Rect *dstrect12_local;
  SDL12_Overlay *overlay12_local;
  
  uVar6 = (*SDL20_ThreadID)();
  rect20.w = (int)(uVar6 == SetVideoModeThread);
  if (overlay12 == (SDL12_Overlay *)0x0) {
    overlay12_local._4_4_ = (*SDL20_SetError)("Parameter \'%s\' is invalid","overlay");
  }
  else if (dstrect12 == (SDL12_Rect *)0x0) {
    overlay12_local._4_4_ = (*SDL20_SetError)("Parameter \'%s\' is invalid","dstrect");
  }
  else {
    register0x00000000 = LockVideoRenderer();
    if (register0x00000000 == (SDL_Renderer *)0x0) {
      overlay12_local._4_4_ = (*SDL20_SetError)("No software screen surface available");
    }
    else {
      for (hwdata = (SDL12_YUVData *)QueuedDisplayOverlays.next; hwdata != (SDL12_YUVData *)0x0;
          hwdata = (SDL12_YUVData *)hwdata->pixelbuf) {
        if ((SDL12_Overlay *)hwdata->texture20 == overlay12) {
          if (rect20.w != 0) {
            if (VideoSurfaceUpdatedInBackgroundThread == SDL_FALSE) {
              if (VideoSurfacePresentTicks != 0) {
                PresentScreen();
              }
            }
            else {
              SDL_Flip(VideoSurface12);
            }
          }
          break;
        }
      }
      pQVar7 = (QueuedOverlayItem *)SDL_malloc(0x18);
      if (pQVar7 == (QueuedOverlayItem *)0x0) {
        UnlockVideoRenderer();
        overlay12_local._4_4_ = (*SDL20_Error)(SDL_ENOMEM);
      }
      else {
        puVar1 = (undefined8 *)overlay12->hwdata;
        if (*(int *)(puVar1 + 1) != 0) {
          sdl_assert_state = SDL_ASSERTION_RETRY;
          sdl_assert_state_1 = SDL_ASSERTION_RETRY;
          rect20.x = overlay12->w;
          rect20.y = overlay12->h;
          if (overlay12->format == 0x56555949) {
            (*SDL20_UpdateYUVTexture)
                      ((SDL_Texture *)*puVar1,(SDL_Rect *)&sdl_assert_state_1,(Uint8 *)puVar1[3],
                       (uint)*(ushort *)(puVar1 + 6),(Uint8 *)puVar1[4],
                       (uint)*(ushort *)((long)puVar1 + 0x32),(Uint8 *)puVar1[5],
                       (uint)*(ushort *)((long)puVar1 + 0x34));
          }
          else if (overlay12->format == 0x32315659) {
            (*SDL20_UpdateYUVTexture)
                      ((SDL_Texture *)*puVar1,(SDL_Rect *)&sdl_assert_state_1,(Uint8 *)puVar1[3],
                       (uint)*(ushort *)(puVar1 + 6),(Uint8 *)puVar1[5],
                       (uint)*(ushort *)((long)puVar1 + 0x34),(Uint8 *)puVar1[4],
                       (uint)*(ushort *)((long)puVar1 + 0x32));
          }
          else {
            (*SDL20_UpdateTexture)
                      ((SDL_Texture *)*puVar1,(SDL_Rect *)&sdl_assert_state_1,(void *)puVar1[3],
                       (uint)*(ushort *)(puVar1 + 6));
          }
          if (overlay12->pixels == (Uint8 **)0x0) {
            *(undefined4 *)(puVar1 + 1) = 0;
          }
        }
        pQVar7->overlay12 = overlay12;
        (*SDL20_memcpy)(&pQVar7->dstrect12,dstrect12,8);
        pQVar7->next = (QueuedOverlayItem *)0x0;
        do {
          if (QueuedDisplayOverlaysTail != (QueuedOverlayItem *)0x0) goto LAB_00111562;
          SVar4 = (*SDL20_ReportAssertion)
                            (&SDL_DisplayYUVOverlay::sdl_assert_data,"SDL_DisplayYUVOverlay",
                             "/workspace/llm4binary/github/license_c_cmakelists/libsdl-org[P]sdl12-compat/src/SDL12_compat.c"
                             ,0x1f2d);
        } while (SVar4 == SDL_ASSERTION_RETRY);
        if (SVar4 == SDL_ASSERTION_BREAK) {
          pcVar2 = (code *)swi(3);
          iVar5 = (*pcVar2)();
          return iVar5;
        }
LAB_00111562:
        do {
          if (QueuedDisplayOverlaysTail->next == (QueuedOverlayItem *)0x0) goto LAB_001115af;
          SVar4 = (*SDL20_ReportAssertion)
                            (&SDL_DisplayYUVOverlay::sdl_assert_data_1,"SDL_DisplayYUVOverlay",
                             "/workspace/llm4binary/github/license_c_cmakelists/libsdl-org[P]sdl12-compat/src/SDL12_compat.c"
                             ,0x1f2e);
        } while (SVar4 == SDL_ASSERTION_RETRY);
        if (SVar4 == SDL_ASSERTION_BREAK) {
          pcVar2 = (code *)swi(3);
          iVar5 = (*pcVar2)();
          return iVar5;
        }
LAB_001115af:
        QueuedDisplayOverlaysTail->next = pQVar7;
        UVar3 = VideoSurfaceLastPresentTicks;
        QueuedDisplayOverlaysTail = pQVar7;
        if (VideoSurfacePresentTicks == 0) {
          iVar5 = GetDesiredMillisecondsPerFrame();
          VideoSurfacePresentTicks = UVar3 + iVar5;
        }
        UnlockVideoRenderer();
        overlay12_local._4_4_ = 0;
      }
    }
  }
  return overlay12_local._4_4_;
}

Assistant:

SDLCALL
SDL_DisplayYUVOverlay(SDL12_Overlay *overlay12, SDL12_Rect *dstrect12)
{
    QueuedOverlayItem *overlay;
    SDL12_YUVData *hwdata;
    SDL_Renderer *renderer;
    const SDL_bool ThisIsSetVideoModeThread = (SDL20_ThreadID() == SetVideoModeThread) ? SDL_TRUE : SDL_FALSE;

    if (!overlay12) {
        return SDL20_InvalidParamError("overlay");
    }
    if (!dstrect12) {
        return SDL20_InvalidParamError("dstrect");
    }
    if ((renderer = LockVideoRenderer()) == NULL) {
        return SDL20_SetError("No software screen surface available");
    }

    for (overlay = QueuedDisplayOverlays.next; overlay != NULL; overlay = overlay->next) {
        if (overlay->overlay12 == overlay12) {   /* trying to draw the same overlay twice in one frame? Dump the current surface and overlays to the screen now. */
            /* Force an update of the screen. */
            if (ThisIsSetVideoModeThread) {
                if (VideoSurfaceUpdatedInBackgroundThread) {
                    SDL_Flip(VideoSurface12);  /* this will update the texture and present. */
                } else if (VideoSurfacePresentTicks) {
                    PresentScreen();
                }
            }

            break;
        }
    }

    if ((overlay = (QueuedOverlayItem *) SDL_malloc(sizeof (QueuedOverlayItem))) == NULL) {
        UnlockVideoRenderer();
        return SDL20_OutOfMemory();
    }

    hwdata = (SDL12_YUVData *) overlay12->hwdata;

    /* Upload contents if we've been locked, even if we're _still_ locked, to
       work around an SMPEG quirk. */
    if (hwdata->dirty) {
        SDL_Rect rect20;
        rect20.x = rect20.y = 0;
        rect20.w = overlay12->w;
        rect20.h = overlay12->h;
        if (overlay12->format == SDL12_IYUV_OVERLAY) {
            SDL20_UpdateYUVTexture(hwdata->texture20, &rect20,
                                 hwdata->pixels[0], hwdata->pitches[0],
                                 hwdata->pixels[1], hwdata->pitches[1],
                                 hwdata->pixels[2], hwdata->pitches[2]);
        } else if (overlay12->format == SDL12_YV12_OVERLAY) {
            SDL20_UpdateYUVTexture(hwdata->texture20, &rect20,
                                 hwdata->pixels[0], hwdata->pitches[0],
                                 hwdata->pixels[2], hwdata->pitches[2],
                                 hwdata->pixels[1], hwdata->pitches[1]);
        } else {
            SDL20_UpdateTexture(hwdata->texture20, &rect20, hwdata->pixels[0], hwdata->pitches[0]);
        }

        if (overlay12->pixels == NULL) {  /* must leave it marked as dirty if still locked! */
            hwdata->dirty = SDL_FALSE;
        }
    }

    /* The app may or may not SDL_Flip() after this...queue this to render on the next present,
       and start a timer going to force a present, in case they don't. */

    overlay->overlay12 = overlay12;
    SDL20_memcpy(&overlay->dstrect12, dstrect12, sizeof (SDL12_Rect));
    overlay->next = NULL;

    SDL_assert(QueuedDisplayOverlaysTail != NULL);
    SDL_assert(QueuedDisplayOverlaysTail->next == NULL);
    QueuedDisplayOverlaysTail->next = overlay;
    QueuedDisplayOverlaysTail = overlay;

    if (!VideoSurfacePresentTicks) {
        VideoSurfacePresentTicks = VideoSurfaceLastPresentTicks + GetDesiredMillisecondsPerFrame();  /* flip it later. */
    }

    UnlockVideoRenderer();

    return 0;
}